

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testKNNValidatorLinearIndex(void)

{
  ulong uVar1;
  TypeUnion this;
  bool bVar2;
  UniformWeighting *pUVar3;
  NearestNeighborsIndex *this_00;
  LinearIndex *pLVar4;
  SquaredEuclideanDistance *pSVar5;
  ostream *poVar6;
  Arena *pAVar7;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&MStack_68);
  if (MStack_68._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 0x194;
    pAVar7 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    MStack_68.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar7);
  }
  this = MStack_68.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (MStack_68.Type_.knearestneighborsclassifier_,3,true);
  if (((this.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).total_size_ = 200;
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pUVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::UniformWeighting>
                       (pAVar7);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(this.pipeline_)->names_ + 1))->
    uniformweighting_ = pUVar3;
  }
  this_00 = (this.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar7);
    (this.knearestneighborsclassifier_)->nearestneighborsindex_ = this_00;
  }
  if (this_00->_oneof_case_[0] != 100) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_00);
    this_00->_oneof_case_[0] = 100;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pLVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LinearIndex>(pAVar7)
    ;
    (this_00->IndexType_).linearindex_ = pLVar4;
  }
  if (this_00->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_00);
    this_00->_oneof_case_[1] = 200;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pSVar5 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar7);
    (this_00->DistanceFunction_).squaredeuclideandistance_ = pSVar5;
  }
  CoreML::KNNValidatorTests::addDataPoints(this.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(this.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>(&local_38,&MStack_68);
  bVar2 = CoreML::Result::good(&local_38);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)!bVar2;
}

Assistant:

int testKNNValidatorLinearIndex() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_linearindex();
    nnIndex->mutable_squaredeuclideandistance();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}